

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_ocaml_generator.cc
# Opt level: O2

void __thiscall
t_ocaml_generator::generate_ocaml_struct_sig
          (t_ocaml_generator *this,ostream *out,t_struct *tstruct,bool is_exception)

{
  int *piVar1;
  ostream *poVar2;
  pointer pptVar3;
  pointer pptVar4;
  string tname;
  string mname;
  string x;
  string type;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  type_name_abi_cxx11_(&local_110,this,&tstruct->super_t_type);
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,"class ");
  poVar2 = std::operator<<(poVar2,(string *)&local_110);
  poVar2 = std::operator<<(poVar2," :");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,"object (\'a)");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  std::__cxx11::string::string((string *)&local_b0,"_x",(allocator *)&local_f0);
  t_generator::tmp(&local_90,(t_generator *)this,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  pptVar4 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pptVar3 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (pptVar3 != pptVar4) {
    for (; pptVar4 != pptVar3; pptVar4 = pptVar4 + 1) {
      std::__cxx11::string::string((string *)&local_50,(string *)&(*pptVar4)->name_);
      t_generator::decapitalize(&local_f0,(t_generator *)this,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      render_ocaml_type_abi_cxx11_(&local_70,this,(*pptVar4)->type_);
      poVar2 = t_generator::indent((t_generator *)this,out);
      poVar2 = std::operator<<(poVar2,"method get_");
      poVar2 = std::operator<<(poVar2,(string *)&local_f0);
      poVar2 = std::operator<<(poVar2," : ");
      poVar2 = std::operator<<(poVar2,(string *)&local_70);
      poVar2 = std::operator<<(poVar2," option");
      std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
      poVar2 = t_generator::indent((t_generator *)this,out);
      poVar2 = std::operator<<(poVar2,"method grab_");
      poVar2 = std::operator<<(poVar2,(string *)&local_f0);
      poVar2 = std::operator<<(poVar2," : ");
      poVar2 = std::operator<<(poVar2,(string *)&local_70);
      std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
      poVar2 = t_generator::indent((t_generator *)this,out);
      poVar2 = std::operator<<(poVar2,"method set_");
      poVar2 = std::operator<<(poVar2,(string *)&local_f0);
      poVar2 = std::operator<<(poVar2," : ");
      poVar2 = std::operator<<(poVar2,(string *)&local_70);
      poVar2 = std::operator<<(poVar2," -> unit");
      std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
      if ((*pptVar4)->value_ == (t_const_value *)0x0) {
        poVar2 = t_generator::indent((t_generator *)this,out);
        poVar2 = std::operator<<(poVar2,"method unset_");
        poVar2 = std::operator<<(poVar2,(string *)&local_f0);
        poVar2 = std::operator<<(poVar2," : unit");
        std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
      }
      poVar2 = t_generator::indent((t_generator *)this,out);
      poVar2 = std::operator<<(poVar2,"method reset_");
      poVar2 = std::operator<<(poVar2,(string *)&local_f0);
      poVar2 = std::operator<<(poVar2," : unit");
      std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_f0);
      pptVar3 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    }
  }
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,"method copy : \'a");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,"method write : Protocol.t -> unit");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,"end");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  if (is_exception) {
    poVar2 = t_generator::indent((t_generator *)this,out);
    poVar2 = std::operator<<(poVar2,"exception ");
    std::__cxx11::string::string((string *)&local_d0,(string *)&local_110);
    t_generator::capitalize(&local_f0,(t_generator *)this,&local_d0);
    poVar2 = std::operator<<(poVar2,(string *)&local_f0);
    poVar2 = std::operator<<(poVar2," of ");
    poVar2 = std::operator<<(poVar2,(string *)&local_110);
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,"val read_");
  poVar2 = std::operator<<(poVar2,(string *)&local_110);
  poVar2 = std::operator<<(poVar2," : Protocol.t -> ");
  poVar2 = std::operator<<(poVar2,(string *)&local_110);
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_110);
  return;
}

Assistant:

void t_ocaml_generator::generate_ocaml_struct_sig(ostream& out,
                                                  t_struct* tstruct,
                                                  bool is_exception) {
  const vector<t_field*>& members = tstruct->get_members();
  vector<t_field*>::const_iterator m_iter;
  string tname = type_name(tstruct);
  indent(out) << "class " << tname << " :" << endl;
  indent(out) << "object ('a)" << endl;

  indent_up();

  string x = tmp("_x");
  if (members.size() > 0) {
    for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
      string mname = decapitalize((*m_iter)->get_name());
      string type = render_ocaml_type((*m_iter)->get_type());
      indent(out) << "method get_" << mname << " : " << type << " option" << endl;
      indent(out) << "method grab_" << mname << " : " << type << endl;
      indent(out) << "method set_" << mname << " : " << type << " -> unit" << endl;
      if (!struct_member_persistent(*m_iter))
        indent(out) << "method unset_" << mname << " : unit" << endl;
      indent(out) << "method reset_" << mname << " : unit" << endl;
    }
  }
  indent(out) << "method copy : 'a" << endl;
  indent(out) << "method write : Protocol.t -> unit" << endl;
  indent_down();
  indent(out) << "end" << endl;

  if (is_exception) {
    indent(out) << "exception " << capitalize(tname) << " of " << tname << endl;
  }

  indent(out) << "val read_" << tname << " : Protocol.t -> " << tname << endl;
}